

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_select_code_option(aec_stream *strm)

{
  uint uVar1;
  internal_state *piVar2;
  uint8_t *puVar3;
  internal_state *piVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  code *pcVar14;
  internal_state *state;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  ulong uVar21;
  
  piVar2 = strm->state;
  iVar9 = piVar2->id_len;
  uVar16 = 0xffffffff;
  if (1 < iVar9) {
    uVar16 = strm->block_size;
    iVar17 = uVar16 - piVar2->ref;
    iVar10 = piVar2->k;
    bVar20 = false;
    iVar8 = iVar10;
    bVar5 = iVar10 == 0;
    iVar11 = iVar10;
    uVar12 = 0xffffffffffffffff;
    do {
      do {
        while( true ) {
          while( true ) {
            bVar7 = bVar5;
            iVar6 = iVar8;
            if ((ulong)uVar16 == 0) {
              uVar15 = 0;
            }
            else {
              uVar19 = 0;
              uVar15 = 0;
              do {
                uVar15 = uVar15 + (piVar2->block[uVar19] >> ((byte)iVar6 & 0x1f));
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            uVar19 = (long)((iVar6 + 1) * iVar17) + uVar15;
            if (uVar19 < uVar12) break;
            bVar20 = true;
            iVar8 = iVar10 + -1;
            bVar5 = true;
            if (bVar7) goto LAB_00101950;
          }
          if (uVar12 != 0xffffffffffffffff) {
            bVar7 = true;
          }
          uVar12 = uVar19;
          iVar11 = iVar6;
          bVar5 = bVar7;
          if (!bVar20) break;
          if ((iVar6 == 0) || ((ulong)(long)iVar17 <= uVar15)) goto LAB_00101950;
          bVar20 = true;
          iVar8 = iVar6 + -1;
        }
      } while (((ulong)(long)iVar17 <= uVar15) &&
              (bVar20 = false, iVar8 = iVar6 + 1, iVar6 < piVar2->kmax));
      bVar20 = true;
      iVar8 = iVar10 + -1;
      bVar5 = true;
    } while (!bVar7);
LAB_00101950:
    uVar16 = (uint)uVar12;
    piVar2->k = iVar11;
  }
  if ((ulong)strm->block_size == 0) {
    uVar12 = 1;
  }
  else {
    uVar12 = 1;
    uVar15 = 0;
    do {
      uVar19 = (ulong)piVar2->block[uVar15];
      uVar21 = (ulong)piVar2->block[uVar15 + 1];
      uVar12 = uVar12 + uVar21 + ((uVar19 + uVar21 + 1) * (uVar21 + uVar19) >> 1) + 1;
      if (piVar2->uncomp_len < uVar12) {
        uVar12 = 0xffffffff;
        break;
      }
      uVar15 = uVar15 + 2;
    } while (uVar15 < strm->block_size);
  }
  if (uVar16 < piVar2->uncomp_len) {
    if ((uint)uVar12 <= uVar16) {
LAB_00101a26:
      m_encode_se(strm);
      return 1;
    }
    iVar10 = piVar2->bits;
    uVar16 = piVar2->k;
    uVar18 = uVar16 + 1;
    if (iVar10 < iVar9) {
      iVar9 = iVar9 - iVar10;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar18 >> ((byte)iVar9 & 0x3f));
      iVar10 = iVar9;
      if (8 < iVar9) {
        do {
          iVar9 = iVar10 + -8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar18 >> ((byte)iVar9 & 0x1f));
          bVar5 = 0x10 < iVar10;
          iVar10 = iVar9;
        } while (bVar5);
      }
      piVar2->bits = 8 - iVar9;
      *piVar2->cds = (uint8_t)(uVar18 << ((byte)(8 - iVar9) & 0x1f));
    }
    else {
      piVar2->bits = iVar10 - iVar9;
      *piVar2->cds = *piVar2->cds + (char)(uVar18 << ((byte)(iVar10 - iVar9) & 0x1f));
    }
    if (piVar2->ref != 0) {
      iVar9 = piVar2->bits;
      uVar18 = piVar2->ref_sample;
      uVar1 = strm->bits_per_sample;
      if (iVar9 < (int)uVar1) {
        iVar9 = uVar1 - iVar9;
        puVar3 = piVar2->cds;
        piVar2->cds = puVar3 + 1;
        *puVar3 = *puVar3 + (char)(uVar18 >> ((byte)iVar9 & 0x3f));
        iVar10 = iVar9;
        if (8 < iVar9) {
          do {
            iVar9 = iVar10 + -8;
            puVar3 = piVar2->cds;
            piVar2->cds = puVar3 + 1;
            *puVar3 = (uint8_t)(uVar18 >> ((byte)iVar9 & 0x1f));
            bVar5 = 0x10 < iVar10;
            iVar10 = iVar9;
          } while (bVar5);
        }
        piVar2->bits = 8 - iVar9;
        *piVar2->cds = (uint8_t)(uVar18 << ((byte)(8 - iVar9) & 0x1f));
      }
      else {
        piVar2->bits = iVar9 - uVar1;
        *piVar2->cds = *piVar2->cds + (char)(uVar18 << ((byte)(iVar9 - uVar1) & 0x1f));
      }
    }
    uVar15 = (ulong)piVar2->ref;
    piVar4 = strm->state;
    uVar12 = (ulong)*piVar4->cds << 0x38;
    uVar18 = 7 - piVar4->bits;
    if (uVar15 < strm->block_size) {
      do {
        for (uVar18 = uVar18 + (piVar4->block[uVar15] >> ((byte)uVar16 & 0x1f)) + 1; 0x3f < uVar18;
            uVar18 = uVar18 - 0x40) {
          *(ulong *)piVar4->cds =
               uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
               | uVar12 << 0x38;
          piVar4->cds = piVar4->cds + 8;
          uVar12 = 0;
        }
        uVar12 = uVar12 | 1L << ((ulong)(byte)((byte)uVar18 ^ 0x3f) & 0x3f);
        uVar15 = uVar15 + 1;
      } while (uVar15 < strm->block_size);
    }
    *(ulong *)piVar4->cds =
         uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
    piVar4->cds = piVar4->cds + (uVar18 >> 3);
    piVar4->bits = ~uVar18 & 7;
    if (uVar16 == 0) goto LAB_00101c4e;
    iVar9 = piVar2->ref;
  }
  else {
    if ((uint)uVar12 < piVar2->uncomp_len) goto LAB_00101a26;
    uVar16 = ~(-1 << ((byte)iVar9 & 0x1f));
    iVar10 = piVar2->bits;
    if (iVar10 < iVar9) {
      iVar9 = iVar9 - iVar10;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar16 >> ((byte)iVar9 & 0x3f));
      iVar10 = iVar9;
      if (8 < iVar9) {
        do {
          iVar9 = iVar10 + -8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar16 >> ((byte)iVar9 & 0x1f));
          bVar5 = 0x10 < iVar10;
          iVar10 = iVar9;
        } while (bVar5);
      }
      piVar2->bits = 8 - iVar9;
      *piVar2->cds = (uint8_t)(uVar16 << ((byte)(8 - iVar9) & 0x1f));
    }
    else {
      piVar2->bits = iVar10 - iVar9;
      *piVar2->cds = *piVar2->cds + (char)(uVar16 << ((byte)(iVar10 - iVar9) & 0x1f));
    }
    if (piVar2->ref != 0) {
      *piVar2->block = piVar2->ref_sample;
    }
    uVar16 = strm->bits_per_sample;
    iVar9 = 0;
  }
  emitblock(strm,uVar16,iVar9);
LAB_00101c4e:
  piVar2 = strm->state;
  if (piVar2->direct_out == 0) {
    piVar2->i = 0;
    pcVar14 = m_flush_block_resumable;
  }
  else {
    lVar13 = (long)(*(int *)&piVar2->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar13;
    strm->avail_out = strm->avail_out - lVar13;
    pcVar14 = m_get_block;
  }
  piVar2->mode = pcVar14;
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    uint32_t split_len;
    uint32_t se_len;
    struct internal_state *state = strm->state;

    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}